

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt8<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
               *i_queue,EasyRandom *param_2)

{
  ElementType val;
  reentrant_put_transaction<unsigned_char> transaction;
  uchar local_89;
  reentrant_put_transaction<unsigned_char> local_88;
  reentrant_put_transaction<unsigned_char> local_68;
  reentrant_put_transaction<unsigned_char> local_40;
  
  local_89 = '\b';
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<unsigned_char,unsigned_char&>
            (&local_40,
             (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue,&local_89);
  local_68.m_put.m_control_block = local_40.m_put.m_control_block;
  local_68.m_put.m_next_ptr = local_40.m_put.m_next_ptr;
  local_68.m_put.m_user_storage = local_40.m_put.m_user_storage;
  local_68.m_queue = local_40.m_queue;
  local_40.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_40);
  local_88.m_put.m_control_block = local_68.m_put.m_control_block;
  local_88.m_put.m_next_ptr = local_68.m_put.m_next_ptr;
  local_88.m_put.m_user_storage = local_68.m_put.m_user_storage;
  local_88.m_queue = local_68.m_queue;
  local_68.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_68);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_88.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_88.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_88.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_88.m_queue;
  local_88.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 8;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }